

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.h
# Opt level: O0

void __thiscall
SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>::
SomethingOrDouble(SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                  *this,list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *inSome)

{
  list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *inSome_local;
  SomethingOrDouble<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
  *this_local;
  
  std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::list
            (&this->SomeValue);
  std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::operator=
            (&this->SomeValue,inSome);
  this->IsDouble = false;
  return;
}

Assistant:

SomethingOrDouble(T inSome){SomeValue = inSome;IsDouble = false;}